

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O0

void llvm::yaml::MappingTraits<llvm::DWARFYAML::Data>::mapping(IO *IO,Data *DWARF)

{
  bool bVar1;
  ulong uVar2;
  void *local_20;
  void *oldContext;
  Data *DWARF_local;
  IO *IO_local;
  
  oldContext = DWARF;
  DWARF_local = (Data *)IO;
  local_20 = yaml::IO::getContext(IO);
  yaml::IO::setContext((IO *)DWARF_local,oldContext);
  yaml::IO::mapOptional<std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>>
            ((IO *)DWARF_local,"debug_str",
             (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)((long)oldContext + 0x20))
  ;
  yaml::IO::
  mapOptional<std::vector<llvm::DWARFYAML::Abbrev,std::allocator<llvm::DWARFYAML::Abbrev>>>
            ((IO *)DWARF_local,"debug_abbrev",
             (vector<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_> *)
             ((long)oldContext + 8));
  bVar1 = std::vector<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>::empty
                    ((vector<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_> *)
                     ((long)oldContext + 0x38));
  if ((!bVar1) || (uVar2 = (**(code **)(*(long *)DWARF_local + 0x10))(), (uVar2 & 1) == 0)) {
    yaml::IO::
    mapOptional<std::vector<llvm::DWARFYAML::ARange,std::allocator<llvm::DWARFYAML::ARange>>>
              ((IO *)DWARF_local,"debug_aranges",
               (vector<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_> *)
               ((long)oldContext + 0x38));
  }
  bVar1 = std::vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>::empty
                    ((vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
                      *)((long)oldContext + 0xa0));
  if ((!bVar1) || (uVar2 = (**(code **)(*(long *)DWARF_local + 0x10))(), (uVar2 & 1) == 0)) {
    yaml::IO::mapOptional<llvm::DWARFYAML::PubSection>
              ((IO *)DWARF_local,"debug_pubnames",(PubSection *)((long)oldContext + 0x80));
  }
  bVar1 = std::vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>::empty
                    ((vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
                      *)((long)oldContext + 0xd8));
  if ((!bVar1) || (uVar2 = (**(code **)(*(long *)DWARF_local + 0x10))(), (uVar2 & 1) == 0)) {
    yaml::IO::mapOptional<llvm::DWARFYAML::PubSection>
              ((IO *)DWARF_local,"debug_pubtypes",(PubSection *)((long)oldContext + 0xb8));
  }
  bVar1 = std::vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>::empty
                    ((vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
                      *)((long)oldContext + 0x110));
  if ((!bVar1) || (uVar2 = (**(code **)(*(long *)DWARF_local + 0x10))(), (uVar2 & 1) == 0)) {
    yaml::IO::mapOptional<llvm::DWARFYAML::PubSection>
              ((IO *)DWARF_local,"debug_gnu_pubnames",(PubSection *)((long)oldContext + 0xf0));
  }
  bVar1 = std::vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>::empty
                    ((vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
                      *)((long)oldContext + 0x148));
  if ((!bVar1) || (uVar2 = (**(code **)(*(long *)DWARF_local + 0x10))(), (uVar2 & 1) == 0)) {
    yaml::IO::mapOptional<llvm::DWARFYAML::PubSection>
              ((IO *)DWARF_local,"debug_gnu_pubtypes",(PubSection *)((long)oldContext + 0x128));
  }
  yaml::IO::mapOptional<std::vector<llvm::DWARFYAML::Unit,std::allocator<llvm::DWARFYAML::Unit>>>
            ((IO *)DWARF_local,"debug_info",
             (vector<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_> *)
             ((long)oldContext + 0x160));
  yaml::IO::
  mapOptional<std::vector<llvm::DWARFYAML::LineTable,std::allocator<llvm::DWARFYAML::LineTable>>>
            ((IO *)DWARF_local,"debug_line",
             (vector<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_> *)
             ((long)oldContext + 0x178));
  yaml::IO::setContext((IO *)DWARF_local,&local_20);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::Data>::mapping(IO &IO, DWARFYAML::Data &DWARF) {
  auto oldContext = IO.getContext();
  IO.setContext(&DWARF);
  IO.mapOptional("debug_str", DWARF.DebugStrings);
  IO.mapOptional("debug_abbrev", DWARF.AbbrevDecls);
  if (!DWARF.ARanges.empty() || !IO.outputting())
    IO.mapOptional("debug_aranges", DWARF.ARanges);
  if (!DWARF.PubNames.Entries.empty() || !IO.outputting())
    IO.mapOptional("debug_pubnames", DWARF.PubNames);
  if (!DWARF.PubTypes.Entries.empty() || !IO.outputting())
    IO.mapOptional("debug_pubtypes", DWARF.PubTypes);
  if (!DWARF.GNUPubNames.Entries.empty() || !IO.outputting())
    IO.mapOptional("debug_gnu_pubnames", DWARF.GNUPubNames);
  if (!DWARF.GNUPubTypes.Entries.empty() || !IO.outputting())
    IO.mapOptional("debug_gnu_pubtypes", DWARF.GNUPubTypes);
  IO.mapOptional("debug_info", DWARF.CompileUnits);
  IO.mapOptional("debug_line", DWARF.DebugLines);
  IO.setContext(&oldContext);
}